

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O3

Error __thiscall
asmjit::v1_14::RAInstBuilder::addCallRet(RAInstBuilder *this,RAWorkReg *workReg,uint32_t outId)

{
  int iVar1;
  undefined4 *puVar2;
  FuncNode *pFVar3;
  RABlock *this_00;
  InstControlFlow IVar4;
  char cVar5;
  Error EVar6;
  RABlock *pRVar7;
  RABlock *pRVar8;
  Logger *pLVar9;
  undefined8 extraout_RAX;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  InvokeNode *initialNode;
  uint *puVar14;
  BaseRAPass *pBVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  RABlock **item;
  InvokeNode *invokeNode;
  uint64_t uVar19;
  float __x;
  InstControlFlow IStack_10b4;
  RABlock **ppRStack_10b0;
  LabelNode *pLStack_10a8;
  long lStack_10a0;
  ulong uStack_1098;
  long lStack_1088;
  RABlock *pRStack_1080;
  undefined4 uStack_1078;
  undefined8 uStack_1074;
  undefined8 uStack_106c;
  undefined8 uStack_1064;
  undefined8 uStack_105c;
  undefined8 uStack_1054;
  undefined8 uStack_104c;
  undefined4 uStack_1044;
  uint *puStack_1040;
  uint auStack_1038 [3];
  byte abStack_102a [4082];
  
  if (outId == 0xff) {
    addCallRet();
LAB_00137a2f:
    addCallRet();
  }
  else {
    uVar11 = *(uint *)(workReg + 0x20);
    uVar16 = uVar11 >> 8 & 0xf;
    bVar10 = (byte)outId;
    uVar17 = 1 << (bVar10 & 0x1f);
    *(uint *)(this + 8) = *(uint *)(this + 8) | 0x8a;
    if (3 < (byte)uVar16) goto LAB_00137a2f;
    *(uint *)(this + (ulong)uVar16 * 4 + 0x18) = *(uint *)(this + (ulong)uVar16 * 4 + 0x18) | uVar17
    ;
    *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | 0x101 << ((byte)(uVar11 >> 8) & 0xf);
    lVar13 = *(long *)(workReg + 0x10);
    if (lVar13 != 0) {
      if (*(char *)(lVar13 + 0xf) == -1) {
        *(char *)(lVar13 + 0xc) = *(char *)(lVar13 + 0xc) + '\x01';
        *(byte *)(lVar13 + 8) = *(byte *)(lVar13 + 8) | 0x8a;
        *(byte *)(lVar13 + 0xf) = bVar10;
        return 0;
      }
      return 0x41;
    }
    puVar2 = *(undefined4 **)(this + 0x38);
    if (((long)puVar2 + (-0x40 - (long)this) & 0x1ffffff000U) == 0) {
      *(undefined4 **)(this + 0x38) = puVar2 + 8;
      *puVar2 = *(undefined4 *)workReg;
      *(undefined8 *)(puVar2 + 1) = 0x8affffffff;
      *(undefined2 *)(puVar2 + 3) = 1;
      *(undefined1 *)((long)puVar2 + 0xe) = 0xff;
      *(byte *)((long)puVar2 + 0xf) = bVar10;
      puVar2[4] = 0xffffffff;
      puVar2[5] = uVar17;
      *(undefined8 *)(puVar2 + 6) = 0;
      *(undefined4 **)(workReg + 0x10) = puVar2;
      *(undefined4 *)(workReg + 0x28) = *(undefined4 *)this;
      if (this[(ulong)uVar16 + 0x10] != (RAInstBuilder)0xff) {
        *(int *)(this + 0x10) = *(int *)(this + 0x10) + (1 << ((byte)uVar16 * '\b' & 0x1f));
        return 0;
      }
      goto LAB_00137a39;
    }
  }
  addCallRet();
LAB_00137a39:
  addCallRet();
  pLVar9 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger;
  if (pLVar9 != (Logger *)0x0) {
    Logger::logf(pLVar9,__x);
  }
  EVar6 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::prepare
                    ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this);
  if (EVar6 == 0) {
    if (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
         (Logger *)0x0) &&
       (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                  ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                   (BaseNode *)
                   (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _funcNode,2,(char *)0x0),
       (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
       (Logger *)0x0)) {
      RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                 (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _curBlock,2);
    }
    item = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
            _curBlock;
    pFVar3 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
             _funcNode;
    invokeNode = *(InvokeNode **)&pFVar3->field_0x8;
    if (invokeNode != (InvokeNode *)0x0) {
      pRStack_1080 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._curBlock;
      *(FuncNode **)(pRStack_1080 + 0x10) = pFVar3;
      *(FuncNode **)(pRStack_1080 + 0x18) = pFVar3;
      uStack_1078 = 0xffffffff;
      puStack_1040 = auStack_1038;
      uStack_1074 = 0;
      uStack_106c = 0;
      uStack_1064 = 0;
      uStack_105c = 0;
      uStack_1054 = 0;
      uStack_104c = 0;
      uStack_1044 = 0;
      lStack_10a0 = 0;
      uStack_1098 = 0;
      ppRStack_10b0 = item;
LAB_00137b21:
      do {
        iVar1 = *(int *)&invokeNode->field_0x14;
        if (1 < iVar1 + 1U) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/rabuilders_p.h"
                     ,0x60,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = *(InvokeNode **)&invokeNode->field_0x8;
        if ((invokeNode->field_0x11 & 0x20) == 0) {
          cVar5 = invokeNode->field_0x10;
          if (cVar5 == '\x03') {
            pRVar7 = *item;
            pRVar8 = *(RABlock **)&invokeNode->field_0x20;
            if (pRVar7 == (RABlock *)0x0) {
              *item = pRVar8;
              if (pRVar8 == (RABlock *)0x0) {
                pRVar8 = BaseRAPass::newBlock
                                   ((((RACFGBuilder *)this)->
                                    super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                    (BaseNode *)invokeNode);
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock = pRVar8;
                if (pRVar8 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)&invokeNode->field_0x20 = pRVar8;
                uVar11 = *(uint *)(pRVar8 + 0xc);
              }
              else {
                uVar11 = *(uint *)(pRVar8 + 0xc);
                if ((uVar11 & 1) != 0) goto LAB_00138265;
              }
              *(uint *)(pRVar8 + 0xc) = uVar11 | 4;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _hasCode = false;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _blockRegStats._packed = 0;
              EVar6 = BaseRAPass::addBlock
                                ((((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,pRVar8
                                );
              if (EVar6 != 0) {
                return EVar6;
              }
              pRVar8 = *ppRStack_10b0;
            }
            else if (pRVar8 == (RABlock *)0x0) {
              if ((pRVar7 == pRStack_1080 |
                  (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                  _hasCode) == 1) {
                if (*(InvokeNode **)(pRVar7 + 0x18) == invokeNode) goto LAB_001382fe;
                *(undefined8 *)(pRVar7 + 0x18) = *(undefined8 *)invokeNode;
                *(uint *)(pRVar7 + 0xc) = *(uint *)(pRVar7 + 0xc) | 0x201;
                *(uint *)(pRVar7 + 0x30) =
                     *(uint *)(pRVar7 + 0x30) |
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._blockRegStats._packed;
                pRVar7 = BaseRAPass::newBlock
                                   ((((RACFGBuilder *)this)->
                                    super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                    (BaseNode *)invokeNode);
                if (pRVar7 == (RABlock *)0x0) {
                  return 1;
                }
                pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 4);
                EVar6 = RABlock::appendSuccessor(*ppRStack_10b0,pRVar7);
                if (EVar6 != 0) {
                  return EVar6;
                }
                EVar6 = BaseRAPass::addBlock
                                  ((((RACFGBuilder *)this)->
                                   super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                   pRVar7);
                if (EVar6 != 0) {
                  return EVar6;
                }
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock = pRVar7;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _hasCode = false;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _blockRegStats._packed = 0;
              }
              *(RABlock **)&invokeNode->field_0x20 = pRVar7;
              pRVar8 = pRVar7;
            }
            else {
              pRVar8[0xc] = (RABlock)((byte)pRVar8[0xc] | 4);
              if (pRVar7 == pRVar8) {
                pRVar8 = pRVar7;
                if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _hasCode != false) break;
              }
              else {
                if (*(InvokeNode **)(pRVar7 + 0x18) == invokeNode) {
LAB_001382f9:
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
LAB_001382fe:
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                *(undefined8 *)(pRVar7 + 0x18) = *(undefined8 *)invokeNode;
                *(uint *)(pRVar7 + 0xc) = *(uint *)(pRVar7 + 0xc) | 0x201;
                *(uint *)(pRVar7 + 0x30) =
                     *(uint *)(pRVar7 + 0x30) |
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._blockRegStats._packed;
                EVar6 = RABlock::appendSuccessor(pRVar7,pRVar8);
                if (EVar6 != 0) {
                  return EVar6;
                }
                EVar6 = BaseRAPass::addBlock
                                  ((((RACFGBuilder *)this)->
                                   super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                   pRVar8);
                if (EVar6 != 0) {
                  return EVar6;
                }
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock = pRVar8;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _hasCode = false;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _blockRegStats._packed = 0;
              }
            }
            item = ppRStack_10b0;
            pLVar9 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._logger;
            if ((pRVar8 == (RABlock *)0x0) ||
               (pRVar8 == (((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._lastLoggedBlock))
            {
LAB_00138123:
              if (pLVar9 != (Logger *)0x0) {
                RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                          ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                           (BaseNode *)invokeNode,2,(char *)0x0);
              }
            }
            else if (pLVar9 != (Logger *)0x0) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,pRVar8,2);
              pLVar9 = (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger;
              goto LAB_00138123;
            }
            if (*(uint32_t *)&invokeNode->field_0x30 ==
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _exitLabelId) {
              pRVar7 = (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
              *(InvokeNode **)(pRVar7 + 0x18) = invokeNode;
              pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 1);
              *(uint *)(pRVar7 + 0x30) =
                   *(uint *)(pRVar7 + 0x30) |
                   (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _blockRegStats._packed;
              EVar6 = BaseRAPass::addExitBlock
                                ((((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,pRVar7
                                );
LAB_00137ee1:
              if (EVar6 != 0) {
                return EVar6;
              }
              goto LAB_00138184;
            }
          }
          else {
            if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _logger != (Logger *)0x0) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                         (BaseNode *)invokeNode,4,(char *)0x0);
              cVar5 = invokeNode->field_0x10;
            }
            if (cVar5 == '\n') {
              if (invokeNode ==
                  (InvokeNode *)
                  ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                  _funcNode)->_end) {
                if (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._curBlock == (RABlock *)0x0) ||
                   (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._hasCode & 1U) == 0)) goto LAB_00138265;
                break;
              }
            }
            else if ((cVar5 == '\x10') &&
                    (invokeNode !=
                     (InvokeNode *)
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._funcNode)) break;
          }
        }
        else {
          if (*item == (RABlock *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::removeNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                       (BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_00137b21;
          }
          (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._hasCode =
               true;
          if (invokeNode->field_0x10 == '\x11') {
            if (iVar1 != -1) goto LAB_00137c8a;
LAB_00137ca7:
            *(undefined4 *)&invokeNode->field_0x14 = 0;
          }
          else if (invokeNode->field_0x10 == '\x12') {
            if (iVar1 == -1) goto LAB_00137ca7;
            lVar13 = *(long *)invokeNode;
            EVar6 = a64::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,invokeNode);
            if (EVar6 != 0) {
              return EVar6;
            }
            if (lVar13 != *(long *)invokeNode) {
              if (*(InvokeNode **)(*item + 0x10) == invokeNode) {
                *(undefined8 *)(*item + 0x10) = *(undefined8 *)(lVar13 + 8);
              }
              *(undefined4 *)&invokeNode->field_0x14 = 0xffffffff;
              invokeNode = *(InvokeNode **)(lVar13 + 8);
              if ((invokeNode->field_0x11 & 0x20) == 0) {
                RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                goto LAB_001382f9;
              }
            }
LAB_00137c8a:
            initialNode = *(InvokeNode **)&invokeNode->field_0x8;
          }
          if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                       (BaseNode *)invokeNode,4,(char *)0x0);
          }
          IStack_10b4 = kRegular;
          uStack_1078 = *(undefined4 *)
                         ((((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock + 8);
          uStack_1044 = 0;
          uStack_1054 = 0;
          uStack_104c = 0;
          uStack_1064 = 0;
          uStack_105c = 0;
          uStack_1074 = 0;
          uStack_106c = 0;
          puStack_1040 = auStack_1038;
          EVar6 = a64::RACFGBuilder::onInst
                            ((RACFGBuilder *)this,(InstNode *)invokeNode,&IStack_10b4,
                             (RAInstBuilder *)&uStack_1078);
          if (EVar6 != 0) {
            return EVar6;
          }
          cVar5 = invokeNode->field_0x10;
          if (cVar5 == '\x12') {
            EVar6 = a64::RACFGBuilder::onInvoke
                              ((RACFGBuilder *)this,invokeNode,(RAInstBuilder *)&uStack_1078);
            if (EVar6 != 0) {
              return EVar6;
            }
            cVar5 = invokeNode->field_0x10;
          }
          if (cVar5 == '\x11') {
            EVar6 = a64::RACFGBuilder::onRet
                              ((RACFGBuilder *)this,(FuncRetNode *)invokeNode,
                               (RAInstBuilder *)&uStack_1078);
            if (EVar6 != 0) {
              return EVar6;
            }
            IStack_10b4 = kMaxValue;
          }
          else if ((IStack_10b4 == kJump) && (auStack_1038 != puStack_1040)) {
            pBVar15 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._pass;
            uVar11 = 0;
            puVar14 = auStack_1038;
            do {
              if (*(uint *)&pBVar15->field_0x148 <= *puVar14) {
                RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                goto LAB_001382c3;
              }
              if ((*(byte *)(*(long *)(*(long *)&pBVar15->_workRegs + (ulong)*puVar14 * 8) + 0x21) &
                  0xf) == 0) {
                bVar10 = *(byte *)((long)puVar14 + 0xe);
                if (bVar10 == 0xff) {
                  if (1 < uVar11) {
                    RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                    return 1;
                  }
                  uVar12 = (ulong)uVar11;
                  uVar11 = uVar11 + 1;
                  bVar10 = (pBVar15->_scratchRegIndexes)._data[uVar12];
                  *(byte *)((long)puVar14 + 0xe) = bVar10;
                }
                *(uint *)(*item + 0xc0) = *(uint *)(*item + 0xc0) | 1 << (bVar10 & 0x1f);
              }
              puVar14 = puVar14 + 8;
            } while (puVar14 != puStack_1040);
          }
          EVar6 = BaseRAPass::assignRAInst
                            ((((RACFGBuilder *)this)->
                             super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                             (BaseNode *)invokeNode,
                             (((RACFGBuilder *)this)->
                             super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock,
                             (RAInstBuilder *)&uStack_1078);
          IVar4 = IStack_10b4;
          if (EVar6 != 0) {
            return EVar6;
          }
          uVar11 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _blockRegStats._packed | (uint)uStack_1064;
          (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
          _blockRegStats._packed = uVar11;
          if (IStack_10b4 == kRegular) goto LAB_0013818b;
          if (kBranch < IStack_10b4) {
            if (IStack_10b4 != kMaxValue) goto LAB_0013818b;
            pRVar7 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._curBlock;
            *(InvokeNode **)(pRVar7 + 0x18) = invokeNode;
            pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 1);
            *(uint *)(pRVar7 + 0x30) = *(uint *)(pRVar7 + 0x30) | uVar11;
            EVar6 = RABlock::appendSuccessor
                              (pRVar7,(((RACFGBuilder *)this)->
                                      super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                      _retBlock);
            goto LAB_00137ee1;
          }
          pRVar7 = *item;
          *(InvokeNode **)(pRVar7 + 0x18) = invokeNode;
          uVar16 = *(uint *)(pRVar7 + 0xc);
          *(uint *)(pRVar7 + 0xc) = uVar16 | 0x101;
          *(uint *)(pRVar7 + 0x30) = *(uint *)(pRVar7 + 0x30) | uVar11;
          if ((invokeNode->field_0x34 & 2) == 0) {
            if (invokeNode->field_0x12 == 0) break;
            lVar13 = (ulong)((byte)invokeNode->field_0x12 - 1) * 0x10;
            if ((*(uint *)(&invokeNode->field_0x40 + lVar13) & 7) == 5) {
              EVar6 = BaseBuilder::labelNodeOf
                                (&((((RACFGBuilder *)this)->
                                   super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._cc)->
                                  super_BaseBuilder,&pLStack_10a8,
                                 *(uint32_t *)(&invokeNode->field_0x44 + lVar13));
              if (EVar6 != 0) {
                return EVar6;
              }
              pRVar7 = BaseRAPass::newBlockOrExistingAt
                                 ((((RACFGBuilder *)this)->
                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                  pLStack_10a8,(BaseNode **)0x0);
              if (pRVar7 == (RABlock *)0x0) {
                return 1;
              }
              pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 4);
              EVar6 = RABlock::appendSuccessor(*item,pRVar7);
            }
            else {
              *(uint *)(pRVar7 + 0xc) = uVar16 | 0x501;
              if ((invokeNode->field_0x10 == '\x0f') &&
                 (lVar13 = *(long *)&invokeNode->_funcDetail, lVar13 != 0)) {
                pBVar15 = (((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
                uVar19 = pBVar15->_lastTimestamp + 1;
                pBVar15->_lastTimestamp = uVar19;
                uVar11 = *(uint *)(lVar13 + 0x18);
                if ((ulong)uVar11 != 0) {
                  lStack_1088 = *(long *)(lVar13 + 0x10);
                  lVar13 = 0;
                  do {
                    EVar6 = BaseBuilder::labelNodeOf
                                      (&((((RACFGBuilder *)this)->
                                         super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._cc)
                                        ->super_BaseBuilder,&pLStack_10a8,
                                       *(uint32_t *)(lStack_1088 + lVar13));
                    if (EVar6 != 0) {
                      return EVar6;
                    }
                    pRVar7 = BaseRAPass::newBlockOrExistingAt
                                       ((((RACFGBuilder *)this)->
                                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass
                                        ,pLStack_10a8,(BaseNode **)0x0);
                    if (pRVar7 == (RABlock *)0x0) {
                      return 1;
                    }
                    if (*(uint64_t *)(pRVar7 + 0x48) != uVar19) {
                      *(uint64_t *)(pRVar7 + 0x48) = uVar19;
                      pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 4);
                      EVar6 = RABlock::appendSuccessor(*ppRStack_10b0,pRVar7);
                      if (EVar6 != 0) {
                        return EVar6;
                      }
                    }
                    lVar13 = lVar13 + 4;
                  } while ((ulong)uVar11 << 2 != lVar13);
                  pRVar7 = *ppRStack_10b0;
                  item = ppRStack_10b0;
                }
                EVar6 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::
                        shareAssignmentAcrossSuccessors
                                  ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,pRVar7);
              }
              else {
                EVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::append
                                  ((ZoneVector<asmjit::v1_14::RABlock_*> *)&lStack_10a0,
                                   &((((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass)->
                                    _allocator,item);
              }
            }
            if (EVar6 != 0) {
              return EVar6;
            }
          }
          if (IVar4 != kJump) {
            if (initialNode == (InvokeNode *)0x0) break;
            if (initialNode->field_0x10 == '\x03') {
              pRVar7 = *(RABlock **)&initialNode->field_0x20;
              if (pRVar7 == (RABlock *)0x0) {
                pRVar7 = BaseRAPass::newBlock
                                   ((((RACFGBuilder *)this)->
                                    super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                    (BaseNode *)initialNode);
                if (pRVar7 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)&initialNode->field_0x20 = pRVar7;
              }
            }
            else {
              pRVar7 = BaseRAPass::newBlock
                                 ((((RACFGBuilder *)this)->
                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                  (BaseNode *)initialNode);
              if (pRVar7 == (RABlock *)0x0) {
                return 1;
              }
            }
            this_00 = *item;
            pRVar8 = this_00 + 0xc;
            *(uint *)pRVar8 = *(uint *)pRVar8 | 0x200;
            EVar6 = RABlock::prependSuccessor(this_00,pRVar7);
            if (EVar6 != 0) {
              return EVar6;
            }
            (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
            _curBlock = pRVar7;
            (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._hasCode
                 = false;
            (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
            _blockRegStats._packed = 0;
            if (((byte)pRVar7[0xc] & 1) != 0) {
LAB_00138265:
              lVar13 = lStack_10a0;
              pBVar15 = (((RACFGBuilder *)this)->
                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
              if (pBVar15->_createdBlockCount == *(uint32_t *)&pBVar15->field_0xb8) {
                uVar12 = uStack_1098 & 0xffffffff;
                if (uVar12 != 0) {
                  lVar18 = 0;
                  do {
                    RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::handleBlockWithUnknownJump
                              ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                               *(RABlock **)(lVar13 + lVar18));
                    lVar18 = lVar18 + 8;
                  } while (uVar12 << 3 != lVar18);
                  pBVar15 = (((RACFGBuilder *)this)->
                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
                }
                EVar6 = BaseRAPass::initSharedAssignments
                                  (pBVar15,&(((RACFGBuilder *)this)->
                                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                            _sharedAssignmentsMap);
                return EVar6;
              }
              return 3;
            }
            EVar6 = BaseRAPass::addBlock
                              ((((RACFGBuilder *)this)->
                               super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,pRVar7);
            if (EVar6 != 0) {
              return EVar6;
            }
            invokeNode = initialNode;
            if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _logger != (Logger *)0x0) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                         (((RACFGBuilder *)this)->
                         super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock,2);
            }
            goto LAB_00137b21;
          }
LAB_00138184:
          *item = (RABlock *)0x0;
        }
LAB_0013818b:
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
LAB_001382c3:
    EVar6 = 3;
  }
  return EVar6;
}

Assistant:

Error addCallRet(RAWorkReg* workReg, uint32_t outId) noexcept {
    ASMJIT_ASSERT(outId != BaseReg::kIdBad);

    RATiedFlags flags = RATiedFlags::kOut | RATiedFlags::kWrite | RATiedFlags::kOutFixed;
    RegGroup group = workReg->group();
    RegMask outRegs = Support::bitMask(outId);

    _aggregatedFlags |= flags;
    _used[group] |= outRegs;
    _stats.makeFixed(group);
    _stats.makeUsed(group);

    RATiedReg* tiedReg = workReg->tiedReg();
    if (!tiedReg) {
      // Could happen when the builder is not reset properly after each instruction.
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, Support::allOnes<RegMask>(), BaseReg::kIdBad, 0, outRegs, outId, 0);

      workReg->setTiedReg(tiedReg);
      workReg->assignBasicBlock(_basicBlockId);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (tiedReg->hasOutId())
        return DebugUtils::errored(kErrorOverlappedRegs);

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->setOutId(outId);
      return kErrorOk;
    }
  }